

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  _Prime_rehash_policy *filename;
  size_t sVar1;
  size_type sVar2;
  pointer pbVar3;
  ulong uVar4;
  pointer ppcVar5;
  pointer ppMVar6;
  MUFile *text;
  pointer pQVar7;
  pointer pcVar8;
  key_type *pkVar9;
  bool bVar10;
  bool bVar11;
  FileFormat FVar12;
  int iVar13;
  string *psVar14;
  string *psVar15;
  char *pcVar16;
  cmSourceFile *pcVar17;
  __node_base_ptr p_Var18;
  mapped_type *this_00;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID id;
  ulong uVar19;
  __node_base_ptr extraout_RDX;
  __node_base_ptr extraout_RDX_00;
  __node_base_ptr p_Var20;
  __node_base_ptr extraout_RDX_01;
  __node_base_ptr extraout_RDX_02;
  __node_base_ptr extraout_RDX_03;
  __node_base_ptr extraout_RDX_04;
  __node_base_ptr extraout_RDX_05;
  __node_base_ptr extraout_RDX_06;
  __node_base_ptr extraout_RDX_07;
  __node_base_ptr extraout_RDX_08;
  pointer pbVar21;
  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  *eMuf_1;
  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var22;
  long lVar23;
  pointer pQVar24;
  pointer pQVar25;
  long lVar26;
  key_type *__rhs;
  undefined1 rcc;
  _Hash_node_base *in_R8;
  _Hash_node_base *p_Var27;
  __node_base_ptr p_Var28;
  _Alloc_hider _Var29;
  pointer ppcVar30;
  Qrc *qrc_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  pointer pQVar32;
  iterator __begin3;
  cmQtAutoGenGlobalInitializer *pcVar33;
  pointer ppMVar34;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  cmMakefile *pcVar35;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar36;
  pair<std::__detail::_Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>,_bool>
  pVar37;
  string pathError;
  string opts;
  MUFileHandle eMuf;
  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
  extraHeaders;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  anon_class_16_2_e88080e7 makeMUFile;
  Qrc qrc;
  undefined1 local_298 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  cmMakefile *local_258;
  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_250;
  anon_class_16_2_e88080e7 local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  cmQtAutoGenGlobalInitializer *local_220;
  string local_218;
  string *local_1f0;
  vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>> *local_1e8
  ;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1e0;
  string *local_1d8;
  string *local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [32];
  string local_198;
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  size_t local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  char local_f0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined2 local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  pointer pbStack_88;
  pointer local_80;
  pointer pbStack_78;
  string local_70;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_258 = cmTarget::GetMakefile(this->Target->Target);
  pcVar33 = this->GlobalInitializer;
  local_1c8._8_8_ = &pcVar33->Keywords_;
  local_218._M_dataplus._M_p = (pointer)0x0;
  local_218._M_string_length = 0;
  local_218.field_2._M_allocated_capacity = 0;
  local_1c8._0_8_ = this;
  cmGeneratorTarget::GetConfigCommonSourceFiles
            (this->Target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_218);
  sVar2 = local_218._M_string_length;
  local_220 = pcVar33;
  if (local_218._M_dataplus._M_p != (pointer)local_218._M_string_length) {
    local_1e8 = (vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                 *)&(this->AutogenTarget).FilesGenerated;
    local_250 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)&(this->AutogenTarget).Sources;
    local_248.kw = (Keywords *)&(this->AutogenTarget).Headers;
    local_1f0 = &(pcVar33->Keywords_).SKIP_AUTOGEN;
    local_1d0 = &(pcVar33->Keywords_).SKIP_AUTORCC;
    local_1d8 = &(pcVar33->Keywords_).AUTORCC_OPTIONS;
    local_1e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &(this->Rcc).Qrcs;
    _Var29._M_p = local_218._M_dataplus._M_p;
    do {
      pcVar17 = *(cmSourceFile **)_Var29._M_p;
      local_298._0_8_ = local_298 + 0x10;
      local_298._8_8_ = (Keywords *)0x0;
      local_298._16_8_ = local_298._16_8_ & 0xffffffffffffff00;
      psVar14 = cmSourceFile::GetFullPath(pcVar17,(string *)local_298);
      if (((Keywords *)local_298._8_8_ == (Keywords *)0x0) && (psVar14->_M_string_length != 0)) {
        psVar15 = cmSourceFile::GetExtension_abi_cxx11_(pcVar17);
        if (((this->Moc).super_GenVarsT.Enabled != false) ||
           (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
          FVar12 = cmSystemTools::GetFileFormat(psVar15);
          if (FVar12 == CXX_FILE_FORMAT) {
            in_R8 = (_Hash_node_base *)0x1;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)&local_278,(cmSourceFile *)local_1c8,
                       (string *)pcVar17,SUB81(psVar14,0));
            if (((*(char *)(local_278._M_allocated_capacity + 0x2b) != '\0') ||
                (*(char *)(local_278._M_allocated_capacity + 0x2c) == '\x01')) &&
               (*(char *)(local_278._M_allocated_capacity + 0x28) == '\x01')) {
              local_1b8._0_8_ = local_278._M_allocated_capacity;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>(local_1e8,(MUFile **)local_1b8);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      (local_250,
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_278._M_allocated_capacity + 0x20),&local_278);
          }
          else {
            if (FVar12 != HEADER_FILE_FORMAT) goto LAB_0037f9b8;
            in_R8 = (_Hash_node_base *)0x1;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)&local_278,(cmSourceFile *)local_1c8,
                       (string *)pcVar17,SUB81(psVar14,0));
            if (((*(char *)(local_278._M_allocated_capacity + 0x2b) != '\0') ||
                (*(char *)(local_278._M_allocated_capacity + 0x2c) == '\x01')) &&
               (*(char *)(local_278._M_allocated_capacity + 0x28) == '\x01')) {
              local_1b8._0_8_ = local_278._M_allocated_capacity;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>(local_1e8,(MUFile **)local_1b8);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_248.kw,
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_278._M_allocated_capacity + 0x20),&local_278);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_allocated_capacity !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                      ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_278._M_local_buf,
                       (MUFile *)local_278._M_allocated_capacity);
          }
        }
LAB_0037f9b8:
        if ((((this->Rcc).super_GenVarsT.Enabled == true) &&
            (sVar1 = psVar15->_M_string_length, sVar1 == (pcVar33->Keywords_).qrc._M_string_length))
           && (((sVar1 == 0 ||
                (iVar13 = bcmp((psVar15->_M_dataplus)._M_p,(pcVar33->Keywords_).qrc._M_dataplus._M_p
                               ,sVar1), iVar13 == 0)) &&
               ((bVar10 = cmSourceFile::GetPropertyAsBool(pcVar17,local_1f0), !bVar10 &&
                (bVar10 = cmSourceFile::GetPropertyAsBool(pcVar17,local_1d0), !bVar10)))))) {
          local_1b8._0_8_ = local_1b8 + 0x10;
          local_1b8._8_8_ = (pointer)0x0;
          local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          local_198._M_string_length = 0;
          local_198.field_2._M_local_buf[0] = '\0';
          local_178._M_p = (pointer)&local_168;
          local_170 = 0;
          local_168._M_local_buf[0] = '\0';
          local_158._M_p = (pointer)&local_148;
          local_150 = 0;
          local_148._M_local_buf[0] = '\0';
          local_138._M_p = (pointer)&local_128;
          local_130 = 0;
          local_128._M_local_buf[0] = '\0';
          local_118._M_p = (pointer)&local_108;
          local_110 = 0;
          local_108._M_local_buf[0] = '\0';
          local_f0[0] = '\0';
          local_f0[1] = '\0';
          local_f0[2] = '\0';
          local_f0[3] = '\0';
          local_e8._M_allocated_capacity = 0;
          local_e8._8_8_ = local_f0;
          local_d0 = 0;
          local_c8._M_allocated_capacity = (size_type)&local_b8;
          local_c8._8_8_ = 0;
          local_b8._M_local_buf[0] = '\0';
          local_a8._0_1_ = false;
          local_a8._1_1_ = false;
          local_80 = (pointer)0x0;
          pbStack_78 = (pointer)0x0;
          local_a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pbStack_88 = (pointer)0x0;
          local_a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8._M_p = (pointer)local_e8._8_8_;
          cmsys::SystemTools::GetRealPath((string *)&local_278,psVar14,(string *)0x0);
          std::__cxx11::string::operator=
                    ((string *)(local_1b8 + 0x20),(string *)local_278._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_allocated_capacity != &local_268) {
            operator_delete((void *)local_278._M_allocated_capacity,
                            local_268._M_allocated_capacity + 1);
          }
          cmsys::SystemTools::GetFilenameWithoutLastExtension
                    ((string *)&local_278,(string *)(local_1b8 + 0x20));
          std::__cxx11::string::operator=((string *)&local_178,(string *)local_278._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_allocated_capacity != &local_268) {
            operator_delete((void *)local_278._M_allocated_capacity,
                            local_268._M_allocated_capacity + 1);
          }
          local_a8._0_1_ = pcVar17->IsGenerated;
          pcVar16 = cmSourceFile::GetSafeProperty(pcVar17,local_1d8);
          pcVar33 = local_220;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_278._M_local_buf,pcVar16,(allocator<char> *)&local_238);
          if (local_278._8_8_ != 0) {
            cmSystemTools::ExpandListArgument((string *)&local_278,&local_a0,false);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_allocated_capacity != &local_268) {
            operator_delete((void *)local_278._M_allocated_capacity,
                            local_268._M_allocated_capacity + 1);
          }
          std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
          emplace_back<cmQtAutoGenInitializer::Qrc>
                    ((vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                      *)local_1e0,(Qrc *)local_1b8);
          Qrc::~Qrc((Qrc *)local_1b8);
        }
      }
      if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      _Var29._M_p = _Var29._M_p + 8;
    } while (_Var29._M_p != (pointer)sVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_218._M_dataplus._M_p,
                    local_218.field_2._M_allocated_capacity - (long)local_218._M_dataplus._M_p);
  }
  cmGeneratorTarget::ClearSourcesCache(this->Target);
  if (((this->Moc).super_GenVarsT.Enabled != false) ||
     (id = extraout_EDX, ((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::reserve((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               *)&local_238,(this->AutogenTarget).Sources._M_h._M_element_count * 2);
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    paVar31 = &local_198.field_2;
    local_198._M_dataplus._M_p = (pointer)paVar31;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_1b8 + 0x20),"_p","");
    local_248.kw = (Keywords *)cmMakefile::GetCMakeInstance(local_258);
    psVar14 = (string *)(this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt;
    if (psVar14 != (string *)0x0) {
      do {
        sVar2 = (psVar14->field_2)._M_allocated_capacity;
        if ((*(char *)(sVar2 + 0x2b) != '\0') || (*(char *)(sVar2 + 0x2c) == '\x01')) {
          local_1f0 = psVar14;
          psVar14 = cmSourceFile::GetFullPath(*(cmSourceFile **)(sVar2 + 0x20),(string *)0x0);
          cmQtAutoGen::SubDirPrefix((string *)local_298,psVar14);
          cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&local_278,psVar14);
          std::__cxx11::string::_M_append(local_298,local_278._M_allocated_capacity);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_allocated_capacity != &local_268) {
            operator_delete((void *)local_278._M_allocated_capacity,
                            local_268._M_allocated_capacity + 1);
          }
          p_Var22 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     *)0x0;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_298,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_1b8 + (long)p_Var22));
            local_250 = p_Var22;
            pbVar3 = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)local_248.kw + 0x280))->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar21 = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)local_248.kw + 0x280))->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar3;
                pbVar21 = pbVar21 + 1) {
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_218,local_278._M_allocated_capacity,
                         local_278._8_8_ + local_278._M_allocated_capacity);
              bVar10 = SUB81(&local_218,0);
              std::__cxx11::string::push_back(bVar10);
              std::__cxx11::string::_M_append((char *)&local_218,(ulong)(pbVar21->_M_dataplus)._M_p)
              ;
              pcVar17 = cmMakefile::GetSource(local_258,&local_218,Known);
              if (pcVar17 == (cmSourceFile *)0x0) {
                bVar11 = cmsys::SystemTools::FileExists(&local_218);
                if (bVar11) {
                  pcVar17 = cmMakefile::CreateSource(local_258,&local_218,false,Known);
                }
LAB_0037ff0a:
                if (pcVar17 != (cmSourceFile *)0x0) {
LAB_0037ff1d:
                  in_R8 = (_Hash_node_base *)0x1;
                  InitScanFiles::anon_class_16_2_e88080e7::operator()
                            (&local_248,(cmSourceFile *)local_1c8,(string *)pcVar17,bVar10);
                  if (*(char *)(sVar2 + 0x2b) == '\0') {
                    *(bool *)((long)&((local_248.this)->ConfigDefault)._M_string_length + 3) = false
                    ;
                  }
                  if (*(char *)(sVar2 + 0x2c) == '\0') {
                    *(bool *)((long)&((local_248.this)->ConfigDefault)._M_string_length + 4) = false
                    ;
                  }
                  std::
                  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                  ::
                  emplace_back<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                              *)&local_238,
                             (unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                              *)&local_248);
                  if (local_248.this != (cmQtAutoGenInitializer *)0x0) {
                    std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                              ((default_delete<cmQtAutoGenInitializer::MUFile> *)&local_248,
                               (MUFile *)local_248.this);
                  }
                }
              }
              else {
                uVar4 = (this->AutogenTarget).Headers._M_h._M_bucket_count;
                uVar19 = (ulong)pcVar17 % uVar4;
                p_Var20 = (this->AutogenTarget).Headers._M_h._M_buckets[uVar19];
                p_Var18 = (__node_base_ptr)0x0;
                if ((p_Var20 != (__node_base_ptr)0x0) &&
                   (in_R8 = p_Var20->_M_nxt, p_Var18 = p_Var20, p_Var27 = in_R8,
                   pcVar17 != (cmSourceFile *)in_R8[1]._M_nxt)) {
                  while (in_R8 = p_Var27->_M_nxt, in_R8 != (_Hash_node_base *)0x0) {
                    p_Var18 = (__node_base_ptr)0x0;
                    if (((ulong)in_R8[1]._M_nxt % uVar4 != uVar19) ||
                       (p_Var18 = p_Var27, p_Var27 = in_R8,
                       pcVar17 == (cmSourceFile *)in_R8[1]._M_nxt)) goto LAB_0037fef6;
                  }
                  p_Var18 = (__node_base_ptr)0x0;
                }
LAB_0037fef6:
                if ((p_Var18 == (__node_base_ptr)0x0) || (p_Var18->_M_nxt == (_Hash_node_base *)0x0)
                   ) {
                  if (pcVar17->IsGenerated != false) goto LAB_0037ff0a;
                  bVar11 = cmsys::SystemTools::FileExists(&local_218);
                  if (!bVar11) goto LAB_0037ff7e;
                  goto LAB_0037ff1d;
                }
              }
LAB_0037ff7e:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_allocated_capacity != &local_268) {
              operator_delete((void *)local_278._M_allocated_capacity,
                              local_268._M_allocated_capacity + 1);
            }
            p_Var22 = local_250 + 0x20;
          } while (p_Var22 !=
                   (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)0x40);
          psVar14 = local_1f0;
          if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)(local_298 + 0x10)) {
            operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            psVar14 = local_1f0;
          }
        }
        psVar14 = (string *)(psVar14->_M_dataplus)._M_p;
      } while (psVar14 != (string *)0x0);
    }
    pbVar21 = local_238.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar17 = (cmSourceFile *)
                local_238.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar35 = (pcVar17->Location).Makefile;
        if (((*(undefined1 *)
               ((long)&(pcVar35->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start + 0x1b) != '\0') ||
            (*(undefined1 *)
              ((long)&(pcVar35->FindPackageRootPathStack).
                      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start + 0x1c) == '\x01')) &&
           (*(char *)((long)&(pcVar35->FindPackageRootPathStack).
                             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start + 0x18) == '\x01')) {
          local_298._0_8_ = pcVar35;
          std::
          vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>::
          emplace_back<cmQtAutoGenInitializer::MUFile*>
                    ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                      *)&(this->AutogenTarget).FilesGenerated,(MUFile **)local_298);
        }
        std::
        _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                  ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&(this->AutogenTarget).Headers,
                   (_Elt_pointer *)
                   ((long)&(((pcVar17->Location).Makefile)->FindPackageRootPathStack).
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start + 0x10),pcVar17);
        pcVar17 = (cmSourceFile *)&(pcVar17->Location).AmbiguousDirectory;
      } while (pcVar17 != (cmSourceFile *)pbVar21);
    }
    lVar23 = -0x40;
    do {
      if (paVar31 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar31->_M_allocated_capacity)[-2]) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar31->_M_allocated_capacity)[-2],paVar31->_M_allocated_capacity + 1)
        ;
      }
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar31->_M_allocated_capacity + -4);
      lVar23 = lVar23 + 0x20;
    } while (lVar23 != 0);
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::~vector((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               *)&local_238);
    id = extraout_EDX_00;
  }
  if (((this->Moc).super_GenVarsT.Enabled != false) ||
     (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
    ppcVar30 = (local_258->SourceFiles).
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar5 = (local_258->SourceFiles).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar30 != ppcVar5) {
      local_250 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   *)&(this->AutogenTarget).Sources;
      local_248.kw = (Keywords *)&(this->AutogenTarget).Headers;
      local_1f0 = &(local_220->Keywords_).SKIP_AUTOGEN;
      local_1d0 = &(local_220->Keywords_).SKIP_AUTOUIC;
      local_1d8 = &(local_220->Keywords_).AUTOUIC_OPTIONS;
      local_1e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  &(this->Uic).FileFiles;
      local_50 = (vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  *)&(this->Uic).FileOptions;
      local_1e8 = (vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                   *)&(this->Uic).SkipUi;
      do {
        local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppcVar30;
        local_1b8._8_8_ = (pointer)0x0;
        local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
        local_1b8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1b8 + 0x10);
        psVar14 = cmSourceFile::GetFullPath
                            ((cmSourceFile *)
                             local_238.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(string *)local_1b8);
        p_Var20 = extraout_RDX;
        if (((pointer)local_1b8._8_8_ == (pointer)0x0) && (psVar14->_M_string_length != 0)) {
          psVar15 = cmSourceFile::GetExtension_abi_cxx11_
                              ((cmSourceFile *)
                               local_238.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
          FVar12 = cmSystemTools::GetFileFormat(psVar15);
          if (FVar12 == CXX_FILE_FORMAT) {
            in_R8 = (_Hash_node_base *)(this->AutogenTarget).Sources._M_h._M_bucket_count;
            p_Var20 = (this->AutogenTarget).Sources._M_h._M_buckets
                      [(long)((ulong)local_238.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start % (ulong)in_R8)];
            p_Var18 = (__node_base_ptr)0x0;
            if ((p_Var20 != (__node_base_ptr)0x0) &&
               (p_Var18 = p_Var20, p_Var28 = p_Var20->_M_nxt,
               (cmSourceFile *)
               local_238.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (cmSourceFile *)p_Var20->_M_nxt[1]._M_nxt)) {
              while (p_Var27 = p_Var28->_M_nxt, p_Var27 != (_Hash_node_base *)0x0) {
                p_Var20 = (__node_base_ptr)((ulong)p_Var27[1]._M_nxt % (ulong)in_R8);
                p_Var18 = (__node_base_ptr)0x0;
                if ((p_Var20 !=
                     (__node_base_ptr)
                     ((ulong)local_238.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start % (ulong)in_R8)) ||
                   (p_Var18 = p_Var28, p_Var28 = p_Var27,
                   (cmSourceFile *)
                   local_238.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == (cmSourceFile *)p_Var27[1]._M_nxt))
                goto LAB_003803f5;
              }
              p_Var18 = (__node_base_ptr)0x0;
            }
LAB_003803f5:
            if ((p_Var18 == (__node_base_ptr)0x0) || (p_Var18->_M_nxt == (_Hash_node_base *)0x0)) {
              in_R8 = (_Hash_node_base *)0x0;
              InitScanFiles::anon_class_16_2_e88080e7::operator()
                        ((anon_class_16_2_e88080e7 *)local_298,(cmSourceFile *)local_1c8,
                         local_238.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar14,0));
              if ((*(bool *)(local_298._0_8_ + 0x29) != false) ||
                 (p_Var20 = extraout_RDX_04, *(bool *)(local_298._0_8_ + 0x2a) == true)) {
                pVar37 = std::
                         _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         ::
                         _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                   (local_250,&local_238,local_298);
                p_Var20 = pVar37._8_8_;
              }
LAB_00380440:
              if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)0x0) {
                std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                          ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_298,
                           (MUFile *)local_298._0_8_);
                p_Var20 = extraout_RDX_05;
              }
            }
          }
          else if (FVar12 == HEADER_FILE_FORMAT) {
            in_R8 = (_Hash_node_base *)(this->AutogenTarget).Headers._M_h._M_bucket_count;
            p_Var20 = (this->AutogenTarget).Headers._M_h._M_buckets
                      [(long)((ulong)local_238.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start % (ulong)in_R8)];
            p_Var18 = (__node_base_ptr)0x0;
            if ((p_Var20 != (__node_base_ptr)0x0) &&
               (p_Var18 = p_Var20, p_Var28 = p_Var20->_M_nxt,
               (cmSourceFile *)
               local_238.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (cmSourceFile *)p_Var20->_M_nxt[1]._M_nxt)) {
              while (p_Var27 = p_Var28->_M_nxt, p_Var27 != (_Hash_node_base *)0x0) {
                p_Var20 = (__node_base_ptr)((ulong)p_Var27[1]._M_nxt % (ulong)in_R8);
                p_Var18 = (__node_base_ptr)0x0;
                if ((p_Var20 !=
                     (__node_base_ptr)
                     ((ulong)local_238.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start % (ulong)in_R8)) ||
                   (p_Var18 = p_Var28, p_Var28 = p_Var27,
                   (cmSourceFile *)
                   local_238.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == (cmSourceFile *)p_Var27[1]._M_nxt))
                goto LAB_003803a2;
              }
              p_Var18 = (__node_base_ptr)0x0;
            }
LAB_003803a2:
            if ((p_Var18 == (__node_base_ptr)0x0) || (p_Var18->_M_nxt == (_Hash_node_base *)0x0)) {
              in_R8 = (_Hash_node_base *)0x0;
              InitScanFiles::anon_class_16_2_e88080e7::operator()
                        ((anon_class_16_2_e88080e7 *)local_298,(cmSourceFile *)local_1c8,
                         local_238.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar14,0));
              if ((*(bool *)(local_298._0_8_ + 0x29) != false) ||
                 (p_Var20 = extraout_RDX_03, *(bool *)(local_298._0_8_ + 0x2a) == true)) {
                pVar37 = std::
                         _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         ::
                         _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                   ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                     *)local_248.kw,&local_238,local_298);
                p_Var20 = pVar37._8_8_;
              }
              goto LAB_00380440;
            }
          }
          else {
            p_Var20 = extraout_RDX_00;
            if ((((this->Uic).super_GenVarsT.Enabled == true) &&
                (p_Var20 = (__node_base_ptr)psVar15->_M_string_length,
                p_Var20 == (__node_base_ptr)(local_220->Keywords_).ui._M_string_length)) &&
               ((p_Var20 == (__node_base_ptr)0x0 ||
                (iVar13 = bcmp((psVar15->_M_dataplus)._M_p,
                               (local_220->Keywords_).ui._M_dataplus._M_p,(size_t)p_Var20),
                p_Var20 = extraout_RDX_01, iVar13 == 0)))) {
              cmsys::SystemTools::GetRealPath((string *)local_298,psVar14,(string *)0x0);
              bVar10 = cmSourceFile::GetPropertyAsBool
                                 ((cmSourceFile *)
                                  local_238.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,local_1f0);
              if ((bVar10) ||
                 (bVar10 = cmSourceFile::GetPropertyAsBool
                                     ((cmSourceFile *)
                                      local_238.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,local_1d0), bVar10))
              {
                pVar36 = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::_M_insert_unique<std::__cxx11::string>
                                   ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                     *)local_1e8,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_298);
                p_Var20 = pVar36._8_8_;
              }
              else {
                pcVar16 = cmSourceFile::GetSafeProperty
                                    ((cmSourceFile *)
                                     local_238.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,local_1d8);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_278._M_local_buf,pcVar16,(allocator<char> *)&local_218);
                p_Var20 = extraout_RDX_06;
                if (local_278._8_8_ != 0) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            (local_1e0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_298);
                  local_218._M_dataplus._M_p = (pointer)0x0;
                  local_218._M_string_length = 0;
                  local_218.field_2._M_allocated_capacity = 0;
                  cmSystemTools::ExpandListArgument
                            ((string *)&local_278,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_218,false);
                  std::
                  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ::
                  emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (local_50,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_218);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_218);
                  p_Var20 = extraout_RDX_07;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._M_allocated_capacity != &local_268) {
                  operator_delete((void *)local_278._M_allocated_capacity,
                                  local_268._M_allocated_capacity + 1);
                  p_Var20 = extraout_RDX_08;
                }
              }
              if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)(local_298 + 0x10)) {
                operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
                p_Var20 = extraout_RDX_02;
              }
            }
          }
        }
        id = (PolicyID)p_Var20;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
          id = extraout_EDX_01;
        }
        ppcVar30 = ppcVar30 + 1;
      } while (ppcVar30 != ppcVar5);
    }
  }
  if (((this->Moc).super_GenVarsT.Enabled != false) ||
     (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
    ppMVar34 = (this->AutogenTarget).FilesGenerated.
               super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppMVar6 = (this->AutogenTarget).FilesGenerated.
              super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar34 != ppMVar6) {
      if (this->CMP0071Accept == true) {
        if (ppMVar34 != ppMVar6) {
          do {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(this->AutogenTarget).DependFiles,&(*ppMVar34)->RealPath);
            ppMVar34 = ppMVar34 + 1;
          } while (ppMVar34 != ppMVar6);
        }
      }
      else if (this->CMP0071Warn == true) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        local_1b8._8_8_ = (pointer)0x0;
        local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_298,(cmPolicies *)0x47,id);
        std::__cxx11::string::_M_append(local_1b8,local_298._0_8_);
        pcVar35 = (cmMakefile *)(local_298 + 0x10);
        if ((cmMakefile *)local_298._0_8_ != pcVar35) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        std::__cxx11::string::push_back((char)local_1b8);
        local_298._8_8_ = (Keywords *)0x0;
        local_298._16_8_ = local_298._16_8_ & 0xffffffffffffff00;
        local_298._0_8_ = pcVar35;
        if (((this->Moc).super_GenVarsT.Enabled == true) ||
           ((this->Uic).super_GenVarsT.Enabled != false)) {
          std::__cxx11::string::_M_assign((string *)local_298);
        }
        std::__cxx11::string::append(local_1b8);
        rcc = SUB81(in_R8,0);
        ppMVar34 = (this->AutogenTarget).FilesGenerated.
                   super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar6 = (this->AutogenTarget).FilesGenerated.
                  super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar34 != ppMVar6) {
          do {
            text = *ppMVar34;
            std::__cxx11::string::append(local_1b8);
            cmQtAutoGen::Quoted((string *)&local_278,&text->RealPath);
            std::__cxx11::string::_M_append(local_1b8,local_278._M_allocated_capacity);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_allocated_capacity != &local_268) {
              operator_delete((void *)local_278._M_allocated_capacity,
                              local_268._M_allocated_capacity + 1);
            }
            std::__cxx11::string::push_back((char)local_1b8);
            rcc = SUB81(in_R8,0);
            ppMVar34 = ppMVar34 + 1;
          } while (ppMVar34 != ppMVar6);
        }
        std::__cxx11::string::append(local_1b8);
        cmQtAutoGen::Tools_abi_cxx11_
                  ((string *)&local_278,(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
                   (this->Uic).super_GenVarsT.Enabled,false,(bool)rcc);
        std::__cxx11::string::_M_append(local_1b8,local_278._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_allocated_capacity != &local_268) {
          operator_delete((void *)local_278._M_allocated_capacity,
                          local_268._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append(local_1b8);
        std::__cxx11::string::_M_append(local_1b8,local_298._0_8_);
        std::__cxx11::string::append(local_1b8);
        std::__cxx11::string::_M_append(local_1b8,local_298._0_8_);
        std::__cxx11::string::append(local_1b8);
        cmMakefile::IssueMessage(local_258,AUTHOR_WARNING,(string *)local_1b8);
        if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
        }
      }
    }
  }
  if ((this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_250 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)CONCAT44(local_250._4_4_,(this->QtVersion).Major);
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar16 = cmGeneratorTarget::GetSafeProperty
                        (this->Target,&(local_220->Keywords_).AUTORCC_OPTIONS);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,pcVar16,(allocator<char> *)local_298);
    cmSystemTools::ExpandListArgument((string *)local_1b8,&local_238,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
    }
    pQVar25 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar7 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar25 != pQVar7) {
      lVar23 = 0;
      pQVar32 = pQVar25;
      do {
        pQVar32->Unique = true;
        pQVar24 = pQVar25;
        lVar26 = lVar23;
        do {
          if (((lVar26 != 0) &&
              (sVar1 = (pQVar32->QrcName)._M_string_length,
              sVar1 == (pQVar24->QrcName)._M_string_length)) &&
             ((sVar1 == 0 ||
              (iVar13 = bcmp((pQVar32->QrcName)._M_dataplus._M_p,(pQVar24->QrcName)._M_dataplus._M_p
                             ,sVar1), iVar13 == 0)))) {
            pQVar32->Unique = false;
            break;
          }
          pQVar24 = pQVar24 + 1;
          lVar26 = lVar26 + -0x148;
        } while (pQVar24 != pQVar7);
        pQVar32 = pQVar32 + 1;
        lVar23 = lVar23 + 0x148;
      } while (pQVar32 != pQVar7);
    }
    cmFilePathChecksum::cmFilePathChecksum((cmFilePathChecksum *)local_1b8,local_258);
    pcVar35 = (cmMakefile *)
              (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_248.kw = (Keywords *)
                   (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar35 != (cmMakefile *)local_248.kw) {
      do {
        cmFilePathChecksum::getPart
                  ((string *)local_298,(cmFilePathChecksum *)local_1b8,
                   (string *)
                   &(pcVar35->FindPackageRootPathStack).
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last,10);
        std::__cxx11::string::operator=
                  ((string *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&pcVar35->CMP0054ReportedIds + 1),(string *)local_298);
        if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        local_298._0_8_ = local_298 + 0x10;
        pcVar8 = (this->Dir).Build._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,pcVar8,pcVar8 + (this->Dir).Build._M_string_length);
        std::__cxx11::string::append((char *)local_298);
        std::__cxx11::string::_M_append
                  ((char *)local_298,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&pcVar35->CMP0054ReportedIds)[1]._M_allocated_capacity);
        std::__cxx11::string::append((char *)local_298);
        std::__cxx11::string::_M_append
                  ((char *)local_298,
                   (ulong)(pcVar35->FindPackageRootPathStack).
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last);
        std::__cxx11::string::append((char *)local_298);
        std::__cxx11::string::operator=
                  ((string *)
                   &(pcVar35->SourceFiles).
                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish,(string *)local_298);
        if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        local_298._0_8_ = local_298 + 0x10;
        pcVar8 = (this->Dir).Info._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,pcVar8,pcVar8 + (this->Dir).Info._M_string_length);
        std::__cxx11::string::append((char *)local_298);
        std::__cxx11::string::_M_append
                  (local_298,
                   (ulong)(pcVar35->FindPackageRootPathStack).
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last);
        if (*(char *)((long)&pcVar35->SourceFileSearchIndex + 0x11) == '\0') {
          std::__cxx11::string::_M_append
                    (local_298,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pcVar35->CMP0054ReportedIds)[1]._M_allocated_capacity);
        }
        std::__cxx11::string::_M_assign((string *)pcVar35);
        std::__cxx11::string::append((char *)pcVar35);
        std::__cxx11::string::_M_assign((string *)&pcVar35->Targets);
        std::__cxx11::string::append((char *)&pcVar35->Targets);
        filename = &(pcVar35->Targets)._M_h._M_rehash_policy;
        std::__cxx11::string::_M_assign((string *)filename);
        std::__cxx11::string::append((char *)filename);
        local_258 = pcVar35;
        if (this->MultiConfig == true) {
          __rhs = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pkVar9 = (this->ConfigsList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__rhs != pkVar9) {
            do {
              std::operator+(&local_218,"_",__rhs);
              cmQtAutoGen::AppendFilenameSuffix((string *)&local_278,(string *)filename,&local_218);
              this_00 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&(pcVar35->AliasTargets)._M_t._M_impl.super__Rb_tree_header,
                                     __rhs);
              std::__cxx11::string::operator=((string *)this_00,(string *)local_278._M_local_buf);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_allocated_capacity != &local_268) {
                operator_delete((void *)local_278._M_allocated_capacity,
                                local_268._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              __rhs = __rhs + 1;
            } while (__rhs != pkVar9);
          }
        }
        if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        pcVar35 = (cmMakefile *)&(local_258->KnownFileSearchIndex)._M_h._M_before_begin;
      } while (pcVar35 != (cmMakefile *)local_248.kw);
    }
    lVar23 = -0x100;
    paVar31 = &local_c8;
    do {
      if (paVar31 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar31->_M_allocated_capacity)[-2]) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar31->_M_allocated_capacity)[-2],paVar31->_M_allocated_capacity + 1)
        ;
      }
      if (&paVar31->_M_allocated_capacity + -4 != (size_type *)(&paVar31->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar31->_M_allocated_capacity)[-6],
                        (&paVar31->_M_allocated_capacity)[-4] + 1);
      }
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar31->_M_allocated_capacity + -8);
      lVar23 = lVar23 + 0x40;
    } while (lVar23 != 0);
    pQVar25 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar7 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar25 != pQVar7) {
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_298,&local_238);
        local_1b8._0_8_ = local_1b8 + 0x10;
        pcVar8 = (pQVar25->QrcName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,pcVar8,pcVar8 + (pQVar25->QrcName)._M_string_length);
        if ((pointer)local_1b8._8_8_ != (pointer)0x0) {
          pbVar21 = (pointer)0x0;
          do {
            if (*(char *)(local_1b8._0_8_ + (long)pbVar21) == '-') {
              *(char *)(local_1b8._0_8_ + (long)pbVar21) = '_';
            }
            pbVar21 = (pointer)((long)&(pbVar21->_M_dataplus)._M_p + 1);
          } while ((pointer)local_1b8._8_8_ != pbVar21);
        }
        if (pQVar25->Unique == false) {
          std::__cxx11::string::append((char *)local_1b8);
          std::__cxx11::string::_M_append
                    ((char *)local_1b8,(ulong)(pQVar25->PathChecksum)._M_dataplus._M_p);
        }
        local_278._M_allocated_capacity = 0;
        local_278._8_8_ = 0;
        local_268._M_allocated_capacity = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[6]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_278._M_local_buf,(char (*) [6])0x5549d6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_278._M_local_buf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_298,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_278,4 < (uint)local_250);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_278);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
        }
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_298,&pQVar25->Options,4 < (uint)local_250);
        local_1b8._0_8_ =
             (pQVar25->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1b8._8_8_ =
             (pQVar25->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1b8._16_8_ =
             (pQVar25->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pQVar25->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_298._0_8_;
        (pQVar25->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_298._8_8_;
        (pQVar25->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_298._16_8_;
        local_298._0_8_ = (cmMakefile *)0x0;
        local_298._8_8_ = (Keywords *)0x0;
        local_298._16_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_298);
        pQVar25 = pQVar25 + 1;
      } while (pQVar25 != pQVar7);
    }
    pQVar25 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar7 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar25 != pQVar7) {
      files = &pQVar25->Resources;
      do {
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(files + -2))[1]._M_local_buf[0] == '\0') {
          local_298._0_8_ = local_298 + 0x10;
          local_298._8_8_ = (Keywords *)0x0;
          local_298._16_8_ = local_298._16_8_ & 0xffffffffffffff00;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar8 = (this->Rcc).super_GenVarsT.Executable._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar8,
                     pcVar8 + (this->Rcc).super_GenVarsT.Executable._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,
                   &((this->Rcc).super_GenVarsT.ExecutableFeatures.
                     super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->ListOptions);
          cmQtAutoGen::RccLister::RccLister((RccLister *)local_1b8,&local_70,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          bVar10 = cmQtAutoGen::RccLister::list
                             ((RccLister *)local_1b8,
                              (string *)
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(files + -0xc) + 1),files,(string *)local_298,false);
          if (bVar10) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_1b8 + 0x20));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
            }
            if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)(local_298 + 0x10)) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            }
          }
          else {
            cmSystemTools::Error((string *)local_298);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_1b8 + 0x20));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
            }
            if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)(local_298 + 0x10)) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            }
            if (!bVar10) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_238);
              return false;
            }
          }
        }
        pQVar25 = (pointer)(files + 1);
        files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)(files + 0xd) + 0x10);
      } while (pQVar25 != pQVar7);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_238);
  }
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  auto const& kw = this->GlobalInitializer->kw();

  auto makeMUFile = [this, &kw](cmSourceFile* sf, std::string const& fullPath,
                                bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->RealPath = cmSystemTools::GetRealPath(fullPath);
    muf->SF = sf;
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOMOC));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUFile = [&](MUFileHandle&& muf, bool isHeader) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    if (isHeader) {
      this->AutogenTarget.Headers.emplace(muf->SF, std::move(muf));
    } else {
      this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
    }
  };

  // Scan through target files
  {
    // Scan through target files
    std::vector<cmSourceFile*> srcFiles;
    this->Target->GetConfigCommonSourceFiles(srcFiles);
    for (cmSourceFile* sf : srcFiles) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        switch (cmSystemTools::GetFileFormat(ext)) {
          case cmSystemTools::HEADER_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), true);
            break;
          case cmSystemTools::CXX_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), false);
            break;
          default:
            break;
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((ext == kw.qrc) && !sf->GetPropertyAsBool(kw.SKIP_AUTOGEN) &&
            !sf->GetPropertyAsBool(kw.SKIP_AUTORCC)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = cmSystemTools::GetRealPath(fullPath);
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = sf->GetIsGenerated();
          // RCC options
          {
            std::string const opts = sf->GetSafeProperty(kw.AUTORCC_OPTIONS);
            if (!opts.empty()) {
              cmSystemTools::ExpandListArgument(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetConfigCommonSourceFiles computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->Target->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    std::vector<MUFileHandle> extraHeaders;
    extraHeaders.reserve(this->AutogenTarget.Sources.size() * 2);
    // Header search suffixes and extensions
    std::array<std::string, 2> const suffixes{ { "", "_p" } };
    auto const& exts = makefile->GetCMakeInstance()->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& srcPath = muf.SF->GetFullPath();
        std::string basePath = cmQtAutoGen::SubDirPrefix(srcPath);
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(srcPath);
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = basePath + suffix;
          for (auto const& ext : exts) {
            std::string fullPath = suffixedPath;
            fullPath += '.';
            fullPath += ext;

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf = makefile->GetSource(fullPath, locationKind);
            if (sf != nullptr) {
              // Check if we know about this header already
              if (this->AutogenTarget.Headers.find(sf) !=
                  this->AutogenTarget.Headers.end()) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf != nullptr) {
              auto eMuf = makeMUFile(sf, fullPath, true);
              // Ony process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              extraHeaders.emplace_back(std::move(eMuf));
            }
          }
        }
      }
    }
    // Move generated files to main headers list
    for (auto& eMuf : extraHeaders) {
      addMUFile(std::move(eMuf), true);
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (cmSourceFile* sf : makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      auto const fileFormat = cmSystemTools::GetFileFormat(ext);
      if (fileFormat == cmSystemTools::HEADER_FILE_FORMAT) {
        if (this->AutogenTarget.Headers.find(sf) ==
            this->AutogenTarget.Headers.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Headers.emplace(sf, std::move(muf));
          }
        }
      } else if (fileFormat == cmSystemTools::CXX_FILE_FORMAT) {
        if (this->AutogenTarget.Sources.find(sf) ==
            this->AutogenTarget.Sources.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Sources.emplace(sf, std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (ext == kw.ui)) {
        // .ui file
        std::string realPath = cmSystemTools::GetRealPath(fullPath);
        bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(kw.AUTOUIC_OPTIONS);
          if (!uicOpts.empty()) {
            this->Uic.FileFiles.push_back(std::move(realPath));
            std::vector<std::string> optsVec;
            cmSystemTools::ExpandListArgument(uicOpts, optsVec);
            this->Uic.FileOptions.push_back(std::move(optsVec));
          }
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(std::move(realPath));
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->RealPath);
      }
    } else if (this->CMP0071Warn) {
      std::string msg;
      msg += cmPolicies::GetPolicyWarning(cmPolicies::CMP0071);
      msg += '\n';
      std::string property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = kw.SKIP_AUTOGEN;
      } else if (this->Moc.Enabled) {
        property = kw.SKIP_AUTOMOC;
      } else if (this->Uic.Enabled) {
        property = kw.SKIP_AUTOUIC;
      }
      msg += "For compatibility, CMake is excluding the GENERATED source "
             "file(s):\n";
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        msg += "  ";
        msg += Quoted(muf->RealPath);
        msg += '\n';
      }
      msg += "from processing by ";
      msg += cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false);
      msg += ". If any of the files should be processed, set CMP0071 to NEW. "
             "If any of the files should not be processed, "
             "explicitly exclude them by setting the source file property ";
      msg += property;
      msg += ":\n  set_property(SOURCE file.h PROPERTY ";
      msg += property;
      msg += " ON)\n";
      makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
    }
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget;
    cmSystemTools::ExpandListArgument(
      this->Target->GetSafeProperty(kw.AUTORCC_OPTIONS), optionsTarget);

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      for (Qrc& qrc : this->Rcc.Qrcs) {
        qrc.PathChecksum = fpathCheckSum.getPart(qrc.QrcFile);
        // RCC output file name
        {
          std::string rccFile = this->Dir.Build + "/";
          rccFile += qrc.PathChecksum;
          rccFile += "/qrc_";
          rccFile += qrc.QrcName;
          rccFile += ".cpp";
          qrc.RccFile = std::move(rccFile);
        }
        {
          std::string base = this->Dir.Info;
          base += "/RCC";
          base += qrc.QrcName;
          if (!qrc.Unique) {
            base += qrc.PathChecksum;
          }

          qrc.LockFile = base;
          qrc.LockFile += ".lock";

          qrc.InfoFile = base;
          qrc.InfoFile += "Info.cmake";

          qrc.SettingsFile = base;
          qrc.SettingsFile += "Settings.txt";

          if (this->MultiConfig) {
            for (std::string const& cfg : this->ConfigsList) {
              qrc.ConfigSettingsFile[cfg] =
                AppendFilenameSuffix(qrc.SettingsFile, "_" + cfg);
            }
          }
        }
      }
    }
    // RCC options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += "_";
          name += qrc.PathChecksum;
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // RCC resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        RccLister const lister(this->Rcc.Executable,
                               this->Rcc.ExecutableFeatures->ListOptions);
        if (!lister.list(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}